

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_bcfill.cpp
# Opt level: O2

void __thiscall
PeleLMdummyFill::operator()
          (PeleLMdummyFill *this,IntVect *iv,Array4<double> *dest,int dcomp,int param_4,
          GeometryData *geom,Real param_6,BCRec *bcr,int param_8,int param_9)

{
  long lVar1;
  int iVar2;
  
  lVar1 = (long)dcomp;
  if (((bcr->bc[0] == 3) && (iVar2 = iv->vect[0], iVar2 < (geom->domain).smallend.vect[0])) ||
     ((bcr->bc[3] == 3 && (iVar2 = iv->vect[0], (geom->domain).bigend.vect[0] < iVar2)))) {
    dest->p[((long)iv->vect[1] - (long)(dest->begin).y) * dest->jstride +
            ((long)iVar2 - (long)(dest->begin).x) +
            ((long)iv->vect[2] - (long)(dest->begin).z) * dest->kstride + dest->nstride * lVar1] =
         1.2345e+40;
  }
  if (((bcr->bc[1] == 3) && (iVar2 = iv->vect[1], iVar2 < (geom->domain).smallend.vect[1])) ||
     ((bcr->bc[4] == 3 && (iVar2 = iv->vect[1], (geom->domain).bigend.vect[1] < iVar2)))) {
    dest->p[((long)iVar2 - (long)(dest->begin).y) * dest->jstride +
            ((long)iv->vect[0] - (long)(dest->begin).x) +
            ((long)iv->vect[2] - (long)(dest->begin).z) * dest->kstride + dest->nstride * lVar1] =
         1.2345e+40;
  }
  if (((bcr->bc[2] == 3) && (iVar2 = iv->vect[2], iVar2 < (geom->domain).smallend.vect[2])) ||
     ((bcr->bc[5] == 3 && (iVar2 = iv->vect[2], (geom->domain).bigend.vect[2] < iVar2)))) {
    dest->p[((long)iv->vect[1] - (long)(dest->begin).y) * dest->jstride +
            ((long)iv->vect[0] - (long)(dest->begin).x) +
            ((long)iVar2 - (long)(dest->begin).z) * dest->kstride + lVar1 * dest->nstride] =
         1.2345e+40;
  }
  return;
}

Assistant:

AMREX_GPU_DEVICE
  void operator()(
    const amrex::IntVect& iv,
    amrex::Array4<amrex::Real> const& dest,
    const int dcomp,
    const int /*numcomp*/,
    amrex::GeometryData const& geom,
    const amrex::Real /*time*/,
    const amrex::BCRec* bcr,
    const int /*bcomp*/,
    const int /*orig_comp*/) const
  {
    const int* domlo = geom.Domain().loVect();
    const int* domhi = geom.Domain().hiVect();
    
    const int* bc = bcr->data();

    // Shouldn't actually ever use this, just need something computable.
    // Set to some ridiculous value so we know if it does get used.
    amrex::Real s_ext[1] = {1.2345e40};

    // xlo and xhi
    int idir = 0;
    if ((bc[idir] == amrex::BCType::ext_dir) and (iv[idir] < domlo[idir])) {

	 dest(iv, dcomp) = s_ext[0];
    
    } else if (
       (bc[idir + AMREX_SPACEDIM] == amrex::BCType::ext_dir) and
       (iv[idir] > domhi[idir])) {

	 dest(iv, dcomp) = s_ext[0];
    }


    // ylo and yhi
    idir = 1;
    if ((bc[idir] == amrex::BCType::ext_dir) and (iv[idir] < domlo[idir])) {

      dest(iv, dcomp) = s_ext[0];

    } else if (
       (bc[idir + AMREX_SPACEDIM] == amrex::BCType::ext_dir) and
       (iv[idir] > domhi[idir])) {

	 dest(iv, dcomp) = s_ext[0];
    }

#if AMREX_SPACEDIM == 3
    // zlo and zhi
    idir = 2;
    if ((bc[idir] == amrex::BCType::ext_dir) and (iv[idir] < domlo[idir])) {

	 dest(iv, dcomp) = s_ext[0];

    } else if (
       (bc[idir + AMREX_SPACEDIM] == amrex::BCType::ext_dir) and
       (iv[idir] > domhi[idir])) {

	  dest(iv, dcomp) = s_ext[0];
    }
#endif
  }